

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  allocator local_281;
  string local_280;
  string u8str;
  u32string u32str;
  u16string u16str;
  undefined8 auStack_138 [36];
  
  if (argc < 2) {
    std::operator<<((ostream *)&std::cout,"Usage: benchmark UTF8FILE [ITERATIONS]\n");
    iVar1 = 1;
  }
  else {
    std::ifstream::ifstream(&u16str,argv[1],_S_in);
    u8str._M_dataplus._M_p = (pointer)&u8str.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&u8str,
               *(undefined8 *)((long)auStack_138 + *(long *)(u16str._M_dataplus._M_p + -0xc)),
               0xffffffffffffffff,0,0xffffffff);
    std::ifstream::~ifstream(&u16str);
    anon_unknown.dwarf_ec6a::cpputf8_u8_to_u16(&u16str,&u8str);
    anon_unknown.dwarf_ec6a::cpputf8_u8_to_u32(&u32str,&u8str);
    if (argc == 2) {
      iVar1 = 1;
    }
    else {
      iVar1 = atoi(argv[2]);
    }
    std::__cxx11::string::string((string *)&local_280,"codecvt u8 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::codecvt_u8_to_u16,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"cpputf8 u8 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::cpputf8_u8_to_u16,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"boost u8 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::boost_u8_to_u16,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range u8 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::range_u8_to_u16,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range view u8 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::range_view_u8_to_u16,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::operator<<((ostream *)&std::cout,"\n");
    std::__cxx11::string::string((string *)&local_280,"codecvt u8 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::codecvt_u8_to_u32,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"cpputf8 u8 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::cpputf8_u8_to_u32,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"boost u8 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::boost_u8_to_u32,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range u8 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::range_u8_to_u32,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range view u8 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::string_const&),std::__cxx11::string>
              (anon_unknown.dwarf_ec6a::range_view_u8_to_u32,&u8str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::operator<<((ostream *)&std::cout,"\n");
    std::__cxx11::string::string((string *)&local_280,"codecvt u16 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::codecvt_u16_to_u8,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"cpputf8 u16 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::cpputf8_u16_to_u8,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"boost u16 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::boost_u16_to_u8,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range u16 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::range_u16_to_u8,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range view u16 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::range_view_u16_to_u8,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::operator<<((ostream *)&std::cout,"\n");
    std::__cxx11::string::string((string *)&local_280,"*codecvt u16 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::codecvt_u16_to_u32,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"*cpputf8 u16 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::cpputf8_u16_to_u32,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"boost u16 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::boost_u16_to_u32,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range u16 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::range_u16_to_u32,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range view u16 to u32",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u32string(*)(std::__cxx11::u16string_const&),std::__cxx11::u16string>
              (anon_unknown.dwarf_ec6a::range_view_u16_to_u32,&u16str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::operator<<((ostream *)&std::cout,"\n");
    std::__cxx11::string::string((string *)&local_280,"codecvt u32 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::codecvt_u32_to_u8,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"cpputf8 u32 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::cpputf8_u32_to_u8,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"boost u32 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::boost_u32_to_u8,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range u32 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::range_u32_to_u8,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range view u32 to u8",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::range_view_u32_to_u8,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::operator<<((ostream *)&std::cout,"\n");
    std::__cxx11::string::string((string *)&local_280,"*codecvt u32 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::codecvt_u32_to_u16,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"*cpputf8 u32 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::cpputf8_u32_to_u16,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"boost u32 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::boost_u32_to_u16,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range u32 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::range_u32_to_u16,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string((string *)&local_280,"range view u32 to u16",&local_281);
    (anonymous_namespace)::
    time_function_call<std::__cxx11::u16string(*)(std::__cxx11::u32string_const&),std::__cxx11::u32string>
              (anon_unknown.dwarf_ec6a::range_view_u32_to_u16,&u32str,iVar1,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::u32string::~u32string((u32string *)&u32str);
    std::__cxx11::u16string::~u16string((u16string *)&u16str);
    std::__cxx11::string::~string((string *)&u8str);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc < 2) {
        std::cout << "Usage: benchmark UTF8FILE [ITERATIONS]\n";
        return 1;
    }

    const string u8str = [argv] {
        std::ifstream f(argv[1]);
        return string(std::istreambuf_iterator<char>{f},
                      std::istreambuf_iterator<char>{});
    }();

    const u16string u16str = cpputf8_u8_to_u16(u8str);
    const u32string u32str = cpputf8_u8_to_u32(u8str);

    const int num_iterations = argc > 2 ? std::atoi(argv[2]) : 1;


    // UTF-8 to UTF-16
    time_function_call(codecvt_u8_to_u16, u8str, num_iterations, "codecvt u8 to u16");
    time_function_call(cpputf8_u8_to_u16, u8str, num_iterations, "cpputf8 u8 to u16");
    time_function_call(boost_u8_to_u16, u8str, num_iterations, "boost u8 to u16");
    time_function_call(range_u8_to_u16, u8str, num_iterations, "range u8 to u16");
    time_function_call(range_view_u8_to_u16, u8str, num_iterations, "range view u8 to u16");
    std::cout << "\n";

    // UTF-8 to UTF-32
    time_function_call(codecvt_u8_to_u32, u8str, num_iterations, "codecvt u8 to u32");
    time_function_call(cpputf8_u8_to_u32, u8str, num_iterations, "cpputf8 u8 to u32");
    time_function_call(boost_u8_to_u32, u8str, num_iterations, "boost u8 to u32");
    time_function_call(range_u8_to_u32, u8str, num_iterations, "range u8 to u32");
    time_function_call(range_view_u8_to_u32, u8str, num_iterations, "range view u8 to u32");
    std::cout << "\n";

    // UTF-16 to UTF-8
    time_function_call(codecvt_u16_to_u8, u16str, num_iterations, "codecvt u16 to u8");
    time_function_call(cpputf8_u16_to_u8, u16str, num_iterations, "cpputf8 u16 to u8");
    time_function_call(boost_u16_to_u8, u16str, num_iterations, "boost u16 to u8");
    time_function_call(range_u16_to_u8, u16str, num_iterations, "range u16 to u8");
    time_function_call(range_view_u16_to_u8, u16str, num_iterations, "range view u16 to u8");
    std::cout << "\n";

    // UTF-16 to UTF-32
    time_function_call(codecvt_u16_to_u32, u16str, num_iterations, "*codecvt u16 to u32");
    time_function_call(cpputf8_u16_to_u32, u16str, num_iterations, "*cpputf8 u16 to u32");
    time_function_call(boost_u16_to_u32, u16str, num_iterations, "boost u16 to u32");
    time_function_call(range_u16_to_u32, u16str, num_iterations, "range u16 to u32");
    time_function_call(range_view_u16_to_u32, u16str, num_iterations, "range view u16 to u32");
    std::cout << "\n";

    // UTF-32 to UTF-8
    time_function_call(codecvt_u32_to_u8, u32str, num_iterations, "codecvt u32 to u8");
    time_function_call(cpputf8_u32_to_u8, u32str, num_iterations, "cpputf8 u32 to u8");
    time_function_call(boost_u32_to_u8, u32str, num_iterations, "boost u32 to u8");
    time_function_call(range_u32_to_u8, u32str, num_iterations, "range u32 to u8");
    time_function_call(range_view_u32_to_u8, u32str, num_iterations, "range view u32 to u8");
    std::cout << "\n";

    // UTF-32 to UTF-16
    time_function_call(codecvt_u32_to_u16, u32str, num_iterations, "*codecvt u32 to u16");
    time_function_call(cpputf8_u32_to_u16, u32str, num_iterations, "*cpputf8 u32 to u16");
    time_function_call(boost_u32_to_u16, u32str, num_iterations, "boost u32 to u16");
    time_function_call(range_u32_to_u16, u32str, num_iterations, "range u32 to u16");
    time_function_call(range_view_u32_to_u16, u32str, num_iterations, "range view u32 to u16");
}